

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Initialize(ImGuiContext *context)

{
  int *piVar1;
  ImVector<ImGuiViewport_*> *pIVar2;
  int iVar3;
  ImGuiViewportP **ppIVar4;
  ImGuiViewport **ppIVar5;
  ImGuiID IVar6;
  ImGuiViewportP *pIVar7;
  ImGuiViewportP **__dest;
  ImGuiViewport **__dest_00;
  int iVar8;
  int iVar9;
  ImGuiSettingsHandler ini_handler;
  ImGuiSettingsHandler local_68;
  
  if ((context->Initialized != false) || (context->SettingsLoaded == true)) {
    __assert_fail("!g.Initialized && !g.SettingsLoaded",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x121f,"void ImGui::Initialize(ImGuiContext *)");
  }
  local_68.TypeHash = 0;
  local_68._12_4_ = 0;
  local_68.ApplyAllFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
  local_68.WriteAllFn =
       (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_ImGuiTextBuffer_ptr *)0x0;
  local_68.ReadOpenFn = (_func_void_ptr_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_char_ptr *)0x0;
  local_68.ReadLineFn =
       (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_void_ptr_char_ptr *)0x0;
  local_68.ClearAllFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
  local_68.ReadInitFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
  local_68.UserData = (void *)0x0;
  local_68.TypeName = "Window";
  IVar6 = ImHashStr("Window",0,0);
  local_68.TypeHash = IVar6;
  local_68.ClearAllFn = WindowSettingsHandler_ClearAll;
  local_68.ReadOpenFn = WindowSettingsHandler_ReadOpen;
  local_68.ReadLineFn = WindowSettingsHandler_ReadLine;
  local_68.ApplyAllFn = WindowSettingsHandler_ApplyAll;
  local_68.WriteAllFn = WindowSettingsHandler_WriteAll;
  AddSettingsHandler(&local_68);
  TableSettingsAddSettingsHandler();
  if (GImGui != (ImGuiContext *)0x0) {
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
  }
  pIVar7 = (ImGuiViewportP *)(*GImAllocatorAllocFunc)(0x130,GImAllocatorUserData);
  ImGuiViewportP::ImGuiViewportP(pIVar7);
  (pIVar7->super_ImGuiViewport).ID = 0x11111111;
  (pIVar7->super_ImGuiViewport).Flags = 4;
  *(undefined4 *)&(pIVar7->super_ImGuiViewport).field_0x5c = 0;
  pIVar7->PlatformWindowCreated = true;
  iVar9 = (context->Viewports).Size;
  iVar3 = (context->Viewports).Capacity;
  if (iVar9 == iVar3) {
    iVar9 = iVar9 + 1;
    if (iVar3 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar3 / 2 + iVar3;
    }
    if (iVar9 < iVar8) {
      iVar9 = iVar8;
    }
    if (iVar3 < iVar9) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiViewportP **)(*GImAllocatorAllocFunc)((long)iVar9 << 3,GImAllocatorUserData);
      ppIVar4 = (context->Viewports).Data;
      if (ppIVar4 != (ImGuiViewportP **)0x0) {
        memcpy(__dest,ppIVar4,(long)(context->Viewports).Size << 3);
        ppIVar4 = (context->Viewports).Data;
        if ((ppIVar4 != (ImGuiViewportP **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      }
      (context->Viewports).Data = __dest;
      (context->Viewports).Capacity = iVar9;
    }
  }
  (context->Viewports).Data[(context->Viewports).Size] = pIVar7;
  iVar9 = (context->Viewports).Size;
  (context->Viewports).Size = iVar9 + 1;
  if (-1 < iVar9) {
    pIVar7 = *(context->Viewports).Data;
    iVar9 = (context->PlatformIO).Viewports.Size;
    iVar3 = (context->PlatformIO).Viewports.Capacity;
    if (iVar9 == iVar3) {
      iVar9 = iVar9 + 1;
      if (iVar3 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar3 / 2 + iVar3;
      }
      if (iVar9 < iVar8) {
        iVar9 = iVar8;
      }
      if (iVar3 < iVar9) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest_00 = (ImGuiViewport **)
                    (*GImAllocatorAllocFunc)((long)iVar9 << 3,GImAllocatorUserData);
        ppIVar5 = (context->PlatformIO).Viewports.Data;
        if (ppIVar5 != (ImGuiViewport **)0x0) {
          memcpy(__dest_00,ppIVar5,(long)(context->PlatformIO).Viewports.Size << 3);
          ppIVar5 = (context->PlatformIO).Viewports.Data;
          if ((ppIVar5 != (ImGuiViewport **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(ppIVar5,GImAllocatorUserData);
        }
        (context->PlatformIO).Viewports.Data = __dest_00;
        (context->PlatformIO).Viewports.Capacity = iVar9;
      }
    }
    (context->PlatformIO).Viewports.Data[(context->PlatformIO).Viewports.Size] =
         &pIVar7->super_ImGuiViewport;
    pIVar2 = &(context->PlatformIO).Viewports;
    pIVar2->Size = pIVar2->Size + 1;
    DockContextInitialize(context);
    context->Initialized = true;
    return;
  }
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                ,0x74f,"T &ImVector<ImGuiViewportP *>::operator[](int) [T = ImGuiViewportP *]");
}

Assistant:

void ImGui::Initialize(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Window";
        ini_handler.TypeHash = ImHashStr("Window");
        ini_handler.ClearAllFn = WindowSettingsHandler_ClearAll;
        ini_handler.ReadOpenFn = WindowSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = WindowSettingsHandler_ReadLine;
        ini_handler.ApplyAllFn = WindowSettingsHandler_ApplyAll;
        ini_handler.WriteAllFn = WindowSettingsHandler_WriteAll;
        AddSettingsHandler(&ini_handler);
    }

    // Add .ini handle for ImGuiTable type
    TableSettingsAddSettingsHandler();

    // Create default viewport
    ImGuiViewportP* viewport = IM_NEW(ImGuiViewportP)();
    viewport->ID = IMGUI_VIEWPORT_DEFAULT_ID;
    viewport->Idx = 0;
    viewport->PlatformWindowCreated = true;
    viewport->Flags = ImGuiViewportFlags_OwnedByApp;
    g.Viewports.push_back(viewport);
    g.PlatformIO.Viewports.push_back(g.Viewports[0]);

#ifdef IMGUI_HAS_DOCK
    // Initialize Docking
    DockContextInitialize(&g);
#endif

    g.Initialized = true;
}